

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O3

int __thiscall
vkt::anon_unknown_0::ShaderLibraryGroup::init(ShaderLibraryGroup *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *pvVar2;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *pvVar3;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  ShaderCaseFactory caseFactory;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> local_38;
  ShaderCaseFactory local_20;
  TestContext *local_18;
  
  local_18 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  local_20._vptr_ShaderCaseFactory = (_func_int **)&PTR_createGroup_00cec470;
  pvVar2 = glu::sl::parseFile(&local_38,local_18->m_curArchive,&this->m_filename,&local_20);
  if (local_38.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_38.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pvVar3 = (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)0x0;
    do {
      tcu::TestNode::addChild
                ((TestNode *)this,
                 local_38.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[(long)pvVar3]);
      pvVar3 = (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)
               ((long)&(pvVar3->
                       super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
      pvVar2 = (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)
               ((long)local_38.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_38.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3);
    } while (pvVar3 < pvVar2);
  }
  iVar1 = (int)pvVar2;
  if (local_38.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void init (void)
	{
		ShaderCaseFactory				caseFactory	(m_testCtx);
		const vector<tcu::TestNode*>	children	= glu::sl::parseFile(m_testCtx.getArchive(), m_filename, &caseFactory);

		for (size_t ndx = 0; ndx < children.size(); ndx++)
		{
			try
			{
				addChild(children[ndx]);
			}
			catch (...)
			{
				for (; ndx < children.size(); ndx++)
					delete children[ndx];
				throw;
			}
		}
	}